

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O1

int Saig_ManExtendOneEval2(Vec_Ptr_t *vSimInfo,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  uint uVar4;
  byte bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  
  iVar1 = *(int *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x24);
  if ((-1 < (long)iVar1) && (iVar2 = vSimInfo->nSize, iVar1 < iVar2)) {
    ppvVar3 = vSimInfo->pArray;
    lVar6 = (long)(iFrame >> 4);
    bVar5 = (char)iFrame * '\x02' & 0x1e;
    uVar4 = *(uint *)((long)ppvVar3[iVar1] + lVar6 * 4) >> bVar5 & 3;
    if (((ulong)pObj->pFanin0 & 1) != 0) {
      uVar4 = *(uint *)(&DAT_00951060 + (ulong)uVar4 * 4);
    }
    uVar7 = (uint)*(undefined8 *)&pObj->field_0x18;
    if ((uVar7 & 7) == 3) {
      uVar7 = pObj->Id;
    }
    else {
      if ((uVar7 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                      ,0xe0,"int Saig_ManExtendOneEval2(Vec_Ptr_t *, Aig_Obj_t *, int)");
      }
      iVar1 = *(int *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar1 < 0) || (iVar2 <= iVar1)) goto LAB_0058fef4;
      uVar7 = *(uint *)((long)ppvVar3[iVar1] + lVar6 * 4) >> bVar5 & 3;
      if (((ulong)pObj->pFanin1 & 1) != 0) {
        uVar7 = *(uint *)(&DAT_00951060 + (ulong)uVar7 * 4);
      }
      uVar8 = 0;
      if (((uVar4 != 0) && (uVar8 = 0, uVar7 != 0)) && ((uVar4 != 1 || (uVar8 = 1, uVar7 != 1)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSim.c"
                      ,0x6c,"int Saig_ManSimInfo2And(int, int)");
      }
      uVar7 = pObj->Id;
      uVar4 = uVar8;
    }
    if ((-1 < (int)uVar7) && ((int)uVar7 < iVar2)) {
      uVar8 = *(uint *)((long)ppvVar3[uVar7] + lVar6 * 4);
      *(uint *)((long)ppvVar3[uVar7] + lVar6 * 4) = (uVar8 >> bVar5 & 3 ^ uVar4) << bVar5 ^ uVar8;
      return uVar4;
    }
  }
LAB_0058fef4:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManExtendOneEval2( Vec_Ptr_t * vSimInfo, Aig_Obj_t * pObj, int iFrame )
{
    int Value0, Value1, Value;
    Value0 = Saig_ManSimInfo2Get( vSimInfo, Aig_ObjFanin0(pObj), iFrame );
    if ( Aig_ObjFaninC0(pObj) )
        Value0 = Saig_ManSimInfo2Not( Value0 );
    if ( Aig_ObjIsCo(pObj) )
    {
        Saig_ManSimInfo2Set( vSimInfo, pObj, iFrame, Value0 );
        return Value0;
    }
    assert( Aig_ObjIsNode(pObj) );
    Value1 = Saig_ManSimInfo2Get( vSimInfo, Aig_ObjFanin1(pObj), iFrame );
    if ( Aig_ObjFaninC1(pObj) )
        Value1 = Saig_ManSimInfo2Not( Value1 );
    Value = Saig_ManSimInfo2And( Value0, Value1 );
    Saig_ManSimInfo2Set( vSimInfo, pObj, iFrame, Value );
    return Value;
}